

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O1

int run_test_udp_open(void)

{
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  int iVar3;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uint uVar4;
  int extraout_EAX_02;
  int extraout_EAX_03;
  uv_loop_t *puVar5;
  uv_loop_t *loop;
  undefined1 *in_RCX;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_loop_t *unaff_RBX;
  uv_udp_t *puVar6;
  undefined1 *puVar7;
  undefined8 *puVar8;
  uv_udp_t *handle;
  uv_handle_t *handle_00;
  sockaddr_in *in_R8;
  int64_t eval_b_1;
  int64_t eval_b_6;
  uv_buf_t buf;
  sockaddr_in addr;
  uv_udp_t client2;
  uv_udp_t client;
  undefined1 auStack_828 [16];
  uv_buf_t uStack_818;
  sockaddr sStack_808;
  undefined2 uStack_7f8;
  undefined1 uStack_7f6;
  undefined5 uStack_7f5;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 uStack_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 uStack_7c0;
  undefined8 uStack_7b8;
  undefined6 uStack_7b0;
  undefined2 uStack_7aa;
  undefined6 uStack_7a8;
  undefined8 uStack_7a2;
  uv_udp_t uStack_790;
  uv_udp_send_t uStack_6d8;
  uv_loop_t *puStack_590;
  code *pcStack_588;
  size_t sStack_580;
  size_t sStack_578;
  uv_buf_t uStack_570;
  sockaddr_in sStack_560;
  uv_udp_t uStack_550;
  uv_udp_t uStack_498;
  uv_loop_t *puStack_3e0;
  long lStack_3d0;
  long lStack_3c8;
  sockaddr_in sStack_3c0;
  uv_udp_t uStack_3b0;
  uv_loop_t *puStack_2f8;
  long lStack_2f0;
  long lStack_2e8;
  uv_udp_t uStack_2e0;
  uv_udp_t *puStack_228;
  undefined8 *puStack_200;
  ulong uStack_1f8;
  uv_udp_t *puStack_1f0;
  undefined8 uStack_1e0;
  undefined1 auStack_1d8 [56];
  uv_handle_t *local_1a0;
  uv_buf_t local_198;
  sockaddr_in local_188;
  uv_udp_t local_178;
  uv_udp_t local_c0;
  
  auStack_1d8._40_8_ = (uv__queue *)0x1db431;
  local_198 = uv_buf_init("PING",4);
  auStack_1d8._40_8_ = (uv__queue *)0x1db451;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_188);
  local_c0.data = (void *)(long)iVar1;
  local_178.data = (uv__io_cb)0x0;
  if (local_c0.data == (void *)0x0) {
    auStack_1d8._40_8_ = (uv__queue *)0x1db47c;
    uVar2 = create_udp_socket();
    unaff_RBX = (uv_loop_t *)(ulong)uVar2;
    auStack_1d8._40_8_ = (uv__queue *)0x1db483;
    puVar5 = uv_default_loop();
    auStack_1d8._40_8_ = (uv__queue *)0x1db493;
    iVar1 = uv_udp_init(puVar5,&local_c0);
    local_178.data = (void *)(long)iVar1;
    auStack_1d8._48_8_ = (uv_handle_t *)0x0;
    if ((uv__io_cb)local_178.data != (uv__io_cb)0x0) goto LAB_001db6e0;
    auStack_1d8._40_8_ = (uv__queue *)0x1db4c0;
    iVar1 = uv_udp_open(&local_c0,uVar2);
    local_178.data = (void *)(long)iVar1;
    auStack_1d8._48_8_ = (uv_handle_t *)0x0;
    if ((uv__io_cb)local_178.data != (uv__io_cb)0x0) goto LAB_001db6ed;
    auStack_1d8._40_8_ = (uv__queue *)0x1db4f2;
    iVar1 = uv_udp_bind(&local_c0,(sockaddr *)&local_188,0);
    local_178.data = (void *)(long)iVar1;
    auStack_1d8._48_8_ = (uv_handle_t *)0x0;
    if ((uv__io_cb)local_178.data != (uv__io_cb)0x0) goto LAB_001db6fa;
    auStack_1d8._40_8_ = (uv__queue *)0x1db52b;
    iVar1 = uv_udp_recv_start(&local_c0,alloc_cb,recv_cb);
    local_178.data = (void *)(long)iVar1;
    auStack_1d8._48_8_ = (uv_handle_t *)0x0;
    if ((uv__io_cb)local_178.data != (uv__io_cb)0x0) goto LAB_001db707;
    in_R8 = &local_188;
    in_RCX = (undefined1 *)0x1;
    auStack_1d8._40_8_ = (uv__queue *)0x1db573;
    iVar1 = uv_udp_send(&send_req,&local_c0,&local_198,1,(sockaddr *)in_R8,send_cb);
    local_178.data = (void *)(long)iVar1;
    auStack_1d8._48_8_ = (uv_handle_t *)0x0;
    if ((uv__io_cb)local_178.data != (uv__io_cb)0x0) goto LAB_001db714;
    auStack_1d8._40_8_ = (uv__queue *)0x1db596;
    puVar5 = uv_default_loop();
    auStack_1d8._40_8_ = (uv__queue *)0x1db5a3;
    iVar1 = uv_udp_init(puVar5,&local_178);
    auStack_1d8._48_8_ = SEXT48(iVar1);
    local_1a0 = (uv_handle_t *)0x0;
    if ((uv_handle_t *)auStack_1d8._48_8_ != (uv_handle_t *)0x0) goto LAB_001db721;
    auStack_1d8._40_8_ = (uv__queue *)0x1db5cd;
    iVar1 = uv_udp_open(&local_178,uVar2);
    auStack_1d8._48_8_ = SEXT48(iVar1);
    local_1a0 = (uv_handle_t *)0xffffffffffffffef;
    if ((uv_handle_t *)auStack_1d8._48_8_ != (uv_handle_t *)0xffffffffffffffef) goto LAB_001db72e;
    auStack_1d8._40_8_ = (uv__queue *)0x1db5f7;
    uv_close((uv_handle_t *)&local_178,(uv_close_cb)0x0);
    auStack_1d8._40_8_ = (uv__queue *)0x1db5fc;
    puVar5 = uv_default_loop();
    auStack_1d8._40_8_ = (uv__queue *)0x1db606;
    uv_run(puVar5,UV_RUN_DEFAULT);
    auStack_1d8._48_8_ = (uv_handle_t *)0x1;
    local_1a0 = (uv_handle_t *)(long)send_cb_called;
    if (local_1a0 != (uv_handle_t *)0x1) goto LAB_001db73b;
    auStack_1d8._48_8_ = (uv_handle_t *)0x1;
    local_1a0 = (uv_handle_t *)(long)close_cb_called;
    if (local_1a0 != (uv_handle_t *)0x1) goto LAB_001db748;
    auStack_1d8._48_8_ = local_c0.send_queue_size;
    local_1a0 = (uv_handle_t *)0x0;
    if ((uv_handle_t *)local_c0.send_queue_size != (uv_handle_t *)0x0) goto LAB_001db755;
    auStack_1d8._40_8_ = (uv__queue *)0x1db675;
    unaff_RBX = uv_default_loop();
    auStack_1d8._40_8_ = (uv__queue *)0x1db689;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    auStack_1d8._40_8_ = (uv__queue *)0x1db693;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    auStack_1d8._48_8_ = (uv_handle_t *)0x0;
    auStack_1d8._40_8_ = (uv__queue *)0x1db6a0;
    puVar5 = uv_default_loop();
    auStack_1d8._40_8_ = (uv__queue *)0x1db6a8;
    iVar1 = uv_loop_close(puVar5);
    local_1a0 = (uv_handle_t *)(long)iVar1;
    if ((uv_handle_t *)auStack_1d8._48_8_ == local_1a0) {
      auStack_1d8._40_8_ = (uv__queue *)0x1db6c3;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_1d8._40_8_ = (uv__queue *)0x1db6e0;
    run_test_udp_open_cold_1();
LAB_001db6e0:
    auStack_1d8._40_8_ = (uv__queue *)0x1db6ed;
    run_test_udp_open_cold_2();
LAB_001db6ed:
    auStack_1d8._40_8_ = (uv__queue *)0x1db6fa;
    run_test_udp_open_cold_3();
LAB_001db6fa:
    auStack_1d8._40_8_ = (uv__queue *)0x1db707;
    run_test_udp_open_cold_4();
LAB_001db707:
    auStack_1d8._40_8_ = (uv__queue *)0x1db714;
    run_test_udp_open_cold_5();
LAB_001db714:
    auStack_1d8._40_8_ = (uv__queue *)0x1db721;
    run_test_udp_open_cold_6();
LAB_001db721:
    auStack_1d8._40_8_ = (uv__queue *)0x1db72e;
    run_test_udp_open_cold_7();
LAB_001db72e:
    auStack_1d8._40_8_ = (uv__queue *)0x1db73b;
    run_test_udp_open_cold_8();
LAB_001db73b:
    auStack_1d8._40_8_ = (uv__queue *)0x1db748;
    run_test_udp_open_cold_9();
LAB_001db748:
    auStack_1d8._40_8_ = (uv__queue *)0x1db755;
    run_test_udp_open_cold_10();
LAB_001db755:
    auStack_1d8._40_8_ = (uv__queue *)0x1db762;
    run_test_udp_open_cold_11();
  }
  auStack_1d8._40_8_ = create_udp_socket;
  run_test_udp_open_cold_12();
  auStack_1d8._0_8_ = (void *)0x1db785;
  auStack_1d8._40_8_ = unaff_RBX;
  uVar2 = socket(2,2,0);
  puVar6 = (uv_udp_t *)(ulong)uVar2;
  auStack_1d8._24_8_ = SEXT48((int)uVar2);
  auStack_1d8._16_8_ = 0;
  if ((long)auStack_1d8._24_8_ < 0) {
    auStack_1d8._0_8_ = (void *)0x1db7f8;
    create_udp_socket_cold_2();
  }
  else {
    in_RCX = auStack_1d8 + 0x24;
    auStack_1d8._36_4_ = 1;
    in_R8 = (sockaddr_in *)0x4;
    auStack_1d8._0_8_ = (void *)0x1db7c5;
    iVar1 = setsockopt(uVar2,1,2,in_RCX,4);
    auStack_1d8._24_8_ = SEXT48(iVar1);
    auStack_1d8._16_8_ = 0;
    if ((uv_close_cb)auStack_1d8._24_8_ == (uv_close_cb)0x0) {
      return uVar2;
    }
  }
  puVar7 = auStack_1d8 + 0x10;
  handle = (uv_udp_t *)auStack_1d8;
  auStack_1d8._0_8_ = alloc_cb;
  create_udp_socket_cold_1();
  uStack_1e0 = 0x10000;
  if ((long)puVar7 < 0x10001) {
    *extraout_RDX = alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0x1008540;
  }
  puVar8 = &uStack_1e0;
  puStack_1f0 = (uv_udp_t *)recv_cb;
  auStack_1d8._0_8_ = puVar7;
  alloc_cb_cold_1();
  iVar1 = (int)&puStack_200;
  puStack_1f0 = puVar6;
  if ((long)puVar8 < 0) {
    recv_cb_cold_7();
LAB_001db91b:
    recv_cb_cold_1();
LAB_001db928:
    recv_cb_cold_5();
LAB_001db92d:
    recv_cb_cold_2();
LAB_001db93a:
    recv_cb_cold_3();
LAB_001db947:
    recv_cb_cold_4();
  }
  else {
    if (puVar8 != (undefined8 *)0x0) {
      uStack_1f8 = (ulong)in_R8 & 0xffffffff;
      puStack_200 = (undefined8 *)0x0;
      if (uStack_1f8 != 0) goto LAB_001db91b;
      if (in_RCX == (undefined1 *)0x0) goto LAB_001db928;
      uStack_1f8 = 4;
      in_RCX = (undefined1 *)0x4;
      puStack_200 = puVar8;
      if (puVar8 != (undefined8 *)0x4) goto LAB_001db92d;
      iVar3 = memcmp("PING",(void *)*extraout_RDX_00,4);
      uStack_1f8 = (ulong)iVar3;
      puStack_200 = (undefined8 *)0x0;
      puVar6 = handle;
      if (uStack_1f8 != 0) goto LAB_001db93a;
      iVar3 = uv_udp_recv_stop(handle);
      uStack_1f8 = (ulong)iVar3;
      puStack_200 = (undefined8 *)0x0;
      if (uStack_1f8 == 0) {
        uv_close((uv_handle_t *)handle,close_cb);
        return extraout_EAX_00;
      }
      goto LAB_001db947;
    }
    iVar1 = 0;
    if (in_RCX == (undefined1 *)0x0) {
      return extraout_EAX;
    }
  }
  recv_cb_cold_6();
  if (in_RCX == (undefined1 *)0x0) {
    send_cb_cold_2();
  }
  else if (iVar1 == 0) {
    send_cb_called = send_cb_called + 1;
    uv_close(*(uv_handle_t **)(in_RCX + 0x48),close_cb);
    return extraout_EAX_01;
  }
  send_cb_cold_1();
  puStack_2f8 = (uv_loop_t *)0x1db9be;
  puStack_228 = puVar6;
  uVar2 = create_udp_socket();
  puStack_2f8 = (uv_loop_t *)0x1db9c5;
  uVar4 = create_udp_socket();
  loop = (uv_loop_t *)(ulong)uVar4;
  puStack_2f8 = (uv_loop_t *)0x1db9cc;
  puVar5 = uv_default_loop();
  puStack_2f8 = (uv_loop_t *)0x1db9d9;
  iVar1 = uv_udp_init(puVar5,&uStack_2e0);
  lStack_2e8 = (long)iVar1;
  lStack_2f0 = 0;
  if (lStack_2e8 == 0) {
    puStack_2f8 = (uv_loop_t *)0x1dba03;
    iVar1 = uv_udp_open(&uStack_2e0,uVar2);
    lStack_2e8 = (long)iVar1;
    lStack_2f0 = 0;
    if (lStack_2e8 != 0) goto LAB_001dbaf3;
    puStack_2f8 = (uv_loop_t *)0x1dba2d;
    iVar1 = uv_udp_open(&uStack_2e0,uVar4);
    lStack_2e8 = (long)iVar1;
    lStack_2f0 = -0x10;
    if (lStack_2e8 != -0x10) goto LAB_001dbb00;
    puStack_2f8 = (uv_loop_t *)0x1dba52;
    iVar1 = close(uVar4);
    lStack_2e8 = (long)iVar1;
    lStack_2f0 = 0;
    if (lStack_2e8 != 0) goto LAB_001dbb0d;
    puStack_2f8 = (uv_loop_t *)0x1dba7c;
    uv_close((uv_handle_t *)&uStack_2e0,(uv_close_cb)0x0);
    puStack_2f8 = (uv_loop_t *)0x1dba81;
    puVar5 = uv_default_loop();
    puStack_2f8 = (uv_loop_t *)0x1dba8b;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_2f8 = (uv_loop_t *)0x1dba90;
    loop = uv_default_loop();
    puStack_2f8 = (uv_loop_t *)0x1dbaa4;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    puStack_2f8 = (uv_loop_t *)0x1dbaae;
    uv_run(loop,UV_RUN_DEFAULT);
    lStack_2e8 = 0;
    puStack_2f8 = (uv_loop_t *)0x1dbabc;
    puVar5 = uv_default_loop();
    puStack_2f8 = (uv_loop_t *)0x1dbac4;
    iVar1 = uv_loop_close(puVar5);
    lStack_2f0 = (long)iVar1;
    if (lStack_2e8 == lStack_2f0) {
      puStack_2f8 = (uv_loop_t *)0x1dbada;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_2f8 = (uv_loop_t *)0x1dbaf3;
    run_test_udp_open_twice_cold_1();
LAB_001dbaf3:
    puStack_2f8 = (uv_loop_t *)0x1dbb00;
    run_test_udp_open_twice_cold_2();
LAB_001dbb00:
    puStack_2f8 = (uv_loop_t *)0x1dbb0d;
    run_test_udp_open_twice_cold_3();
LAB_001dbb0d:
    puStack_2f8 = (uv_loop_t *)0x1dbb1a;
    run_test_udp_open_twice_cold_4();
  }
  puStack_2f8 = (uv_loop_t *)run_test_udp_open_bound;
  run_test_udp_open_twice_cold_5();
  puStack_3e0 = (uv_loop_t *)0x1dbb45;
  puStack_2f8 = loop;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_3c0);
  uStack_3b0.data = (void *)(long)iVar1;
  lStack_3d0 = 0;
  if (uStack_3b0.data == (void *)0x0) {
    puStack_3e0 = (uv_loop_t *)0x1dbb6a;
    uVar4 = create_udp_socket();
    loop = (uv_loop_t *)(ulong)uVar4;
    puStack_3e0 = (uv_loop_t *)0x1dbb7d;
    iVar1 = bind(uVar4,(sockaddr *)&sStack_3c0,0x10);
    uStack_3b0.data = (void *)(long)iVar1;
    lStack_3d0 = 0;
    if (uStack_3b0.data != (void *)0x0) goto LAB_001dbcb9;
    puStack_3e0 = (uv_loop_t *)0x1dbba2;
    puVar5 = uv_default_loop();
    puStack_3e0 = (uv_loop_t *)0x1dbbaf;
    iVar1 = uv_udp_init(puVar5,&uStack_3b0);
    lStack_3d0 = (long)iVar1;
    lStack_3c8 = 0;
    if (lStack_3d0 != 0) goto LAB_001dbcc8;
    puStack_3e0 = (uv_loop_t *)0x1dbbdb;
    iVar1 = uv_udp_open(&uStack_3b0,uVar4);
    lStack_3d0 = (long)iVar1;
    lStack_3c8 = 0;
    if (lStack_3d0 != 0) goto LAB_001dbcd7;
    puStack_3e0 = (uv_loop_t *)0x1dbc13;
    iVar1 = uv_udp_recv_start(&uStack_3b0,alloc_cb,recv_cb);
    lStack_3d0 = (long)iVar1;
    lStack_3c8 = 0;
    if (lStack_3d0 != 0) goto LAB_001dbce6;
    puStack_3e0 = (uv_loop_t *)0x1dbc3f;
    uv_close((uv_handle_t *)&uStack_3b0,(uv_close_cb)0x0);
    puStack_3e0 = (uv_loop_t *)0x1dbc44;
    puVar5 = uv_default_loop();
    puStack_3e0 = (uv_loop_t *)0x1dbc4e;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_3e0 = (uv_loop_t *)0x1dbc53;
    loop = uv_default_loop();
    puStack_3e0 = (uv_loop_t *)0x1dbc67;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    puStack_3e0 = (uv_loop_t *)0x1dbc71;
    uv_run(loop,UV_RUN_DEFAULT);
    lStack_3d0 = 0;
    puStack_3e0 = (uv_loop_t *)0x1dbc7f;
    puVar5 = uv_default_loop();
    puStack_3e0 = (uv_loop_t *)0x1dbc87;
    iVar1 = uv_loop_close(puVar5);
    lStack_3c8 = (long)iVar1;
    if (lStack_3d0 == lStack_3c8) {
      puStack_3e0 = (uv_loop_t *)0x1dbc9f;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_3e0 = (uv_loop_t *)0x1dbcb9;
    run_test_udp_open_bound_cold_1();
LAB_001dbcb9:
    puStack_3e0 = (uv_loop_t *)0x1dbcc8;
    run_test_udp_open_bound_cold_2();
LAB_001dbcc8:
    puStack_3e0 = (uv_loop_t *)0x1dbcd7;
    run_test_udp_open_bound_cold_3();
LAB_001dbcd7:
    puStack_3e0 = (uv_loop_t *)0x1dbce6;
    run_test_udp_open_bound_cold_4();
LAB_001dbce6:
    puStack_3e0 = (uv_loop_t *)0x1dbcf5;
    run_test_udp_open_bound_cold_5();
  }
  puStack_3e0 = (uv_loop_t *)run_test_udp_open_connect;
  run_test_udp_open_bound_cold_6();
  pcStack_588 = (code *)0x1dbd1d;
  puStack_3e0 = loop;
  uStack_570 = uv_buf_init("PING",4);
  pcStack_588 = (code *)0x1dbd3d;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_560);
  uStack_498.data = (void *)(long)iVar1;
  uStack_550.data = (void *)0x0;
  if (uStack_498.data == (void *)0x0) {
    pcStack_588 = (code *)0x1dbd68;
    uVar4 = create_udp_socket();
    loop = (uv_loop_t *)(ulong)uVar4;
    pcStack_588 = (code *)0x1dbd6f;
    puVar5 = uv_default_loop();
    pcStack_588 = (code *)0x1dbd7f;
    iVar1 = uv_udp_init(puVar5,&uStack_498);
    uStack_550.data = (void *)(long)iVar1;
    sStack_580 = 0;
    if (uStack_550.data != (void *)0x0) goto LAB_001dbfbd;
    pcStack_588 = (code *)0x1dbdae;
    iVar1 = connect(uVar4,(sockaddr *)&sStack_560,0x10);
    uStack_550.data = (void *)(long)iVar1;
    sStack_580 = 0;
    if (uStack_550.data != (void *)0x0) goto LAB_001dbfca;
    pcStack_588 = (code *)0x1dbddb;
    iVar1 = uv_udp_open(&uStack_498,uVar4);
    uStack_550.data = (void *)(long)iVar1;
    sStack_580 = 0;
    if (uStack_550.data != (void *)0x0) goto LAB_001dbfd7;
    pcStack_588 = (code *)0x1dbdfe;
    puVar5 = uv_default_loop();
    pcStack_588 = (code *)0x1dbe0b;
    iVar1 = uv_udp_init(puVar5,&uStack_550);
    sStack_580 = (size_t)iVar1;
    sStack_578 = 0;
    if (sStack_580 != 0) goto LAB_001dbfe4;
    pcStack_588 = (code *)0x1dbe3a;
    iVar1 = uv_udp_bind(&uStack_550,(sockaddr *)&sStack_560,0);
    sStack_580 = (size_t)iVar1;
    sStack_578 = 0;
    if (sStack_580 != 0) goto LAB_001dbff1;
    pcStack_588 = (code *)0x1dbe70;
    iVar1 = uv_udp_recv_start(&uStack_550,alloc_cb,recv_cb);
    sStack_580 = (size_t)iVar1;
    sStack_578 = 0;
    if (sStack_580 != 0) goto LAB_001dbffe;
    pcStack_588 = (code *)0x1dbeb6;
    iVar1 = uv_udp_send(&send_req,&uStack_498,&uStack_570,1,(sockaddr *)0x0,send_cb);
    sStack_580 = (size_t)iVar1;
    sStack_578 = 0;
    if (sStack_580 != 0) goto LAB_001dc00b;
    pcStack_588 = (code *)0x1dbed9;
    puVar5 = uv_default_loop();
    pcStack_588 = (code *)0x1dbee3;
    uv_run(puVar5,UV_RUN_DEFAULT);
    sStack_580 = 1;
    sStack_578 = (size_t)send_cb_called;
    if (sStack_578 != 1) goto LAB_001dc018;
    sStack_580 = 2;
    sStack_578 = (size_t)close_cb_called;
    if (sStack_578 != 2) goto LAB_001dc025;
    sStack_580 = uStack_498.send_queue_size;
    sStack_578 = 0;
    if (uStack_498.send_queue_size != 0) goto LAB_001dc032;
    pcStack_588 = (code *)0x1dbf52;
    loop = uv_default_loop();
    pcStack_588 = (code *)0x1dbf66;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    pcStack_588 = (code *)0x1dbf70;
    uv_run(loop,UV_RUN_DEFAULT);
    sStack_580 = 0;
    pcStack_588 = (code *)0x1dbf7d;
    puVar5 = uv_default_loop();
    pcStack_588 = (code *)0x1dbf85;
    iVar1 = uv_loop_close(puVar5);
    sStack_578 = (size_t)iVar1;
    if (sStack_580 == sStack_578) {
      pcStack_588 = (code *)0x1dbfa0;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_588 = (code *)0x1dbfbd;
    run_test_udp_open_connect_cold_1();
LAB_001dbfbd:
    pcStack_588 = (code *)0x1dbfca;
    run_test_udp_open_connect_cold_2();
LAB_001dbfca:
    pcStack_588 = (code *)0x1dbfd7;
    run_test_udp_open_connect_cold_3();
LAB_001dbfd7:
    pcStack_588 = (code *)0x1dbfe4;
    run_test_udp_open_connect_cold_4();
LAB_001dbfe4:
    pcStack_588 = (code *)0x1dbff1;
    run_test_udp_open_connect_cold_5();
LAB_001dbff1:
    pcStack_588 = (code *)0x1dbffe;
    run_test_udp_open_connect_cold_6();
LAB_001dbffe:
    pcStack_588 = (code *)0x1dc00b;
    run_test_udp_open_connect_cold_7();
LAB_001dc00b:
    pcStack_588 = (code *)0x1dc018;
    run_test_udp_open_connect_cold_8();
LAB_001dc018:
    pcStack_588 = (code *)0x1dc025;
    run_test_udp_open_connect_cold_9();
LAB_001dc025:
    pcStack_588 = (code *)0x1dc032;
    run_test_udp_open_connect_cold_10();
LAB_001dc032:
    pcStack_588 = (code *)0x1dc03f;
    run_test_udp_open_connect_cold_11();
  }
  pcStack_588 = run_test_udp_send_unix;
  run_test_udp_open_connect_cold_12();
  handle_00 = (uv_handle_t *)auStack_828;
  puStack_590 = loop;
  pcStack_588 = (code *)(ulong)uVar2;
  uStack_818 = uv_buf_init("PING",4);
  puVar5 = uv_default_loop();
  uStack_7f5 = 0;
  uStack_7f0._0_4_ = 0;
  uStack_7f0._4_4_ = 0;
  uStack_7e8 = 0;
  uStack_7e0 = 0;
  uStack_7d8 = 0;
  uStack_7d0 = 0;
  uStack_7c8 = 0;
  uStack_7c0 = 0;
  uStack_7b8 = 0;
  uStack_7b0 = 0;
  uStack_7aa = 0;
  uStack_7a8 = 0;
  uStack_7a2 = 0;
  sStack_808.sa_family = 1;
  uStack_6d8.data = (void *)0x11;
  uStack_790.data = (void *)0x6c;
  builtin_strncpy(sStack_808.sa_data,"/tmp/uv-test-s",0xe);
  uStack_7f8 = 0x636f;
  uStack_7f6 = 0x6b;
  iVar1 = socket(1,1,0);
  uStack_6d8.data = (void *)(long)iVar1;
  uStack_790.data = (void *)0x0;
  if ((long)uStack_6d8.data < 0) {
    uStack_790.data = (void *)0x0;
    run_test_udp_send_unix_cold_8();
LAB_001dc302:
    run_test_udp_send_unix_cold_2();
LAB_001dc317:
    run_test_udp_send_unix_cold_3();
LAB_001dc32c:
    run_test_udp_send_unix_cold_4();
LAB_001dc33c:
    run_test_udp_send_unix_cold_5();
  }
  else {
    unlink("/tmp/uv-test-sock");
    iVar3 = bind(iVar1,&sStack_808,0x6e);
    uStack_6d8.data = (void *)(long)iVar3;
    uStack_790.data = (void *)0x0;
    if (uStack_6d8.data != (void *)0x0) goto LAB_001dc302;
    iVar3 = listen(iVar1,1);
    uStack_6d8.data = (void *)(long)iVar3;
    uStack_790.data = (void *)0x0;
    if (uStack_6d8.data != (void *)0x0) goto LAB_001dc317;
    iVar3 = uv_udp_init(puVar5,&uStack_790);
    uStack_6d8.data = (void *)(long)iVar3;
    auStack_828._0_8_ = (uv_loop_t *)0x0;
    if (uStack_6d8.data != (void *)0x0) goto LAB_001dc32c;
    iVar3 = uv_udp_open(&uStack_790,iVar1);
    uStack_6d8.data = (void *)(long)iVar3;
    auStack_828._0_8_ = (uv_loop_t *)0x0;
    if (uStack_6d8.data != (void *)0x0) goto LAB_001dc33c;
    uv_run(puVar5,UV_RUN_DEFAULT);
    iVar3 = uv_udp_send(&uStack_6d8,&uStack_790,&uStack_818,1,(sockaddr *)&sStack_808,
                        (uv_udp_send_cb)0x0);
    auStack_828._0_8_ = SEXT48(iVar3);
    auStack_828._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_828._0_8_ == (uv_loop_t *)0x0) {
      uv_close((uv_handle_t *)&uStack_790,(uv_close_cb)0x0);
      uv_run(puVar5,UV_RUN_DEFAULT);
      close(iVar1);
      unlink("/tmp/uv-test-sock");
      uv_walk(puVar5,close_walk_cb,(void *)0x0);
      uv_run(puVar5,UV_RUN_DEFAULT);
      auStack_828._0_8_ = (uv_loop_t *)0x0;
      iVar1 = uv_loop_close(puVar5);
      auStack_828._8_8_ = SEXT48(iVar1);
      if (auStack_828._0_8_ == auStack_828._8_8_) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001dc359;
    }
  }
  run_test_udp_send_unix_cold_6();
LAB_001dc359:
  run_test_udp_send_unix_cold_7();
  if (handle_00 != (uv_handle_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX_02;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing(handle_00);
  if (iVar1 == 0) {
    uv_close(handle_00,(uv_close_cb)0x0);
    return extraout_EAX_03;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(udp_open) {
  struct sockaddr_in addr;
  uv_buf_t buf = uv_buf_init("PING", 4);
  uv_udp_t client, client2;
  uv_os_sock_t sock;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  startup();
  sock = create_udp_socket();

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  r = uv_udp_open(&client, sock);
  ASSERT_OK(r);

  r = uv_udp_bind(&client, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_udp_recv_start(&client, alloc_cb, recv_cb);
  ASSERT_OK(r);

  r = uv_udp_send(&send_req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT_OK(r);

#ifndef _WIN32
  {
    r = uv_udp_init(uv_default_loop(), &client2);
    ASSERT_OK(r);

    r = uv_udp_open(&client2, sock);
    ASSERT_EQ(r, UV_EEXIST);

    uv_close((uv_handle_t*) &client2, NULL);
  }
#else  /* _WIN32 */
  (void)client2;
#endif

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, send_cb_called);
  ASSERT_EQ(1, close_cb_called);

  ASSERT_OK(client.send_queue_size);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}